

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
tracing_layer::zeContextSystemBarrier(ze_context_handle_t hContext,ze_device_handle_t hDevice)

{
  _func_void__ze_context_system_barrier_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var1;
  _func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr *zeApiPtr;
  char *pcVar2;
  undefined1 *puVar3;
  ulong *puVar4;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_f0;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_d8;
  undefined1 local_c0 [8];
  APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_pfnContextSystemBarrierCb_t epilogue_callback_ptr;
  ze_pfnContextSystemBarrierCb_t prologueCallbackPtr;
  size_t i;
  tracer_array_t *currentTracerArray;
  APITracerCallbackDataImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  ze_context_system_barrier_params_t tracerParams;
  ze_pfnContextSystemBarrier_t pfnSystemBarrier;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  if (DAT_002da3f0 == (_func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pfnSystemBarrier = (ze_pfnContextSystemBarrier_t)hDevice;
    hDevice_local = (ze_device_handle_t)hContext;
    pcVar2 = (char *)tracingInProgress();
    if (*pcVar2 == '\0') {
      puVar3 = (undefined1 *)tracingInProgress();
      *puVar3 = 1;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&hDevice_local;
      APITracerCallbackDataImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
      puVar4 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar4 != (ulong *)0x0) {
        for (prologueCallbackPtr = (ze_pfnContextSystemBarrierCb_t)0x0;
            prologueCallbackPtr < (ze_pfnContextSystemBarrierCb_t)*puVar4;
            prologueCallbackPtr = prologueCallbackPtr + 1) {
          epilogCallback.pUserData =
               *(void **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x1b0);
          p_Var1 = *(_func_void__ze_context_system_barrier_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x808);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData,(value_type *)&epilogCallback.pUserData);
          epilogCallback.current_api_callback =
               *(_func_void__ze_context_system_barrier_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)(puVar4[1] + 0xcb0 + (long)prologueCallbackPtr * 0xcb8);
          local_c0 = (undefined1  [8])p_Var1;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData.prologCallbacks.
                          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_c0)
          ;
        }
      }
      zeApiPtr = DAT_002da3f0;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_d8,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_f0,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData.prologCallbacks.
                   super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      hContext_local._4_4_ =
           APITracerWrapperImp<_ze_result_t(*)(_ze_context_handle_t*,_ze_device_handle_t*),_ze_context_system_barrier_params_t*,void(*)(_ze_context_system_barrier_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_context_system_barrier_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_context_system_barrier_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_context_system_barrier_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_context_system_barrier_params_t*,_ze_result_t,void*,void**)>>>,_ze_context_handle_t*&,_ze_device_handle_t*&>
                     (zeApiPtr,(_ze_context_system_barrier_params_t *)
                               &apiCallbackData.epilogCallbacks.
                                super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_func_void__ze_context_system_barrier_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                       *)currentTracerArray,&local_d8,&local_f0,
                      (_ze_context_handle_t **)
                      apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_ze_device_handle_t **)&pfnSystemBarrier);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_f0);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_d8);
      APITracerCallbackDataImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_context_system_barrier_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
    }
    else {
      hContext_local._4_4_ =
           (*DAT_002da3f0)((_ze_context_handle_t *)hDevice_local,
                           (_ze_device_handle_t *)pfnSystemBarrier);
    }
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeContextSystemBarrier(
        ze_context_handle_t hContext,                   ///< [in] handle of context object
        ze_device_handle_t hDevice                      ///< [in] handle of the device
        )
    {
        auto pfnSystemBarrier = context.zeDdiTable.Context.pfnSystemBarrier;

        if( nullptr == pfnSystemBarrier)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Context.pfnSystemBarrier, hContext, hDevice);

        // capture parameters
        ze_context_system_barrier_params_t tracerParams = {
            &hContext,
            &hDevice
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnContextSystemBarrierCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnContextSystemBarrierCb_t, Context, pfnSystemBarrierCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Context.pfnSystemBarrier,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phContext,
                                                  *tracerParams.phDevice);
    }